

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::GenerateHierarchy(DXFImporter *this,aiScene *pScene,FileData *param_2)

{
  uint uVar1;
  aiMesh *paVar2;
  aiNode *paVar3;
  uint *puVar4;
  aiNode **ppaVar5;
  aiNode *this_00;
  ulong uVar6;
  
  paVar3 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar3);
  pScene->mRootNode = paVar3;
  aiString::Set((aiString *)paVar3,"<DXF_ROOT>");
  uVar1 = pScene->mNumMeshes;
  if ((ulong)uVar1 == 1) {
    pScene->mRootNode->mNumMeshes = 1;
    puVar4 = (uint *)operator_new__(4);
    pScene->mRootNode->mMeshes = puVar4;
    *pScene->mRootNode->mMeshes = 0;
  }
  else {
    pScene->mRootNode->mNumChildren = uVar1;
    ppaVar5 = (aiNode **)operator_new__((ulong)uVar1 << 3);
    pScene->mRootNode->mChildren = ppaVar5;
    paVar3 = pScene->mRootNode;
    for (uVar6 = 0; uVar6 < paVar3->mNumChildren; uVar6 = uVar6 + 1) {
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      pScene->mRootNode->mChildren[uVar6] = this_00;
      paVar2 = pScene->mMeshes[uVar6];
      if (this_00 != (aiNode *)&paVar2->mName) {
        uVar1 = (paVar2->mName).length;
        (this_00->mName).length = uVar1;
        memcpy((this_00->mName).data,(paVar2->mName).data,(ulong)uVar1);
        (this_00->mName).data[uVar1] = '\0';
      }
      this_00->mNumMeshes = 1;
      puVar4 = (uint *)operator_new__(4);
      this_00->mMeshes = puVar4;
      *puVar4 = (uint)uVar6;
      paVar3 = pScene->mRootNode;
      this_00->mParent = paVar3;
    }
  }
  return;
}

Assistant:

void DXFImporter::GenerateHierarchy(aiScene* pScene, DXF::FileData& /*output*/) {
    // generate the output scene graph, which is just the root node with a single child for each layer.
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<DXF_ROOT>");

    if (1 == pScene->mNumMeshes)    {
        pScene->mRootNode->mMeshes = new unsigned int[ pScene->mRootNode->mNumMeshes = 1 ];
        pScene->mRootNode->mMeshes[0] = 0;
    } else {
        pScene->mRootNode->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren = pScene->mNumMeshes ];
        for (unsigned int m = 0; m < pScene->mRootNode->mNumChildren;++m)   {
            aiNode* p = pScene->mRootNode->mChildren[m] = new aiNode();
            p->mName = pScene->mMeshes[m]->mName;

            p->mMeshes = new unsigned int[p->mNumMeshes = 1];
            p->mMeshes[0] = m;
            p->mParent = pScene->mRootNode;
        }
    }
}